

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy_dictMatchState_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  long *plVar1;
  undefined8 *puVar2;
  U32 UVar3;
  ZSTD_matchState_t *pZVar4;
  U32 *pUVar5;
  seqDef *psVar6;
  undefined8 uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  BYTE *pBVar15;
  int *piVar16;
  long lVar17;
  BYTE *pBVar18;
  ulong uVar19;
  int *piVar20;
  int *piVar21;
  seqStore_t *psVar22;
  ulong uVar23;
  int *piVar24;
  size_t ofbCandidate;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  ulong local_e8;
  BYTE *local_e0;
  uint local_d8;
  uint local_d4;
  int *local_d0;
  int *local_c8;
  ZSTD_matchState_t *local_c0;
  int *local_b8;
  int *local_b0;
  uint local_a4;
  BYTE *local_a0;
  BYTE *local_98;
  BYTE *local_90;
  int *local_88;
  ulong local_80;
  int local_74;
  int local_70;
  int local_6c;
  seqStore_t *local_68;
  int *local_60;
  size_t local_58;
  BYTE *local_50;
  uint *local_48;
  ulong local_40;
  ulong local_38;
  
  local_e0 = (ms->window).base;
  local_d8 = (ms->cParams).minMatch;
  if (5 < local_d8) {
    local_d8 = 6;
  }
  if (local_d8 < 5) {
    local_d8 = 4;
  }
  local_d4 = (ms->cParams).searchLog;
  local_f4 = 6;
  if (local_d4 < 6) {
    local_f4 = local_d4;
  }
  local_a4 = (ms->window).dictLimit;
  local_e8 = (ulong)local_a4;
  if (local_f4 < 5) {
    local_f4 = 4;
  }
  local_98 = local_e0 + local_e8;
  pZVar4 = ms->dictMatchState;
  local_90 = (pZVar4->window).base;
  local_50 = local_90 + (pZVar4->window).dictLimit;
  local_b8 = (int *)(pZVar4->window).nextSrc;
  uVar8 = ((int)src - ((int)local_50 + (int)local_98)) + (int)local_b8;
  piVar21 = (int *)((long)src + (ulong)(uVar8 == 0));
  local_ec = *rep;
  local_c8 = (int *)src;
  local_68 = seqStore;
  if (uVar8 < local_ec) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7977,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_f0 = rep[1];
  local_48 = rep;
  if (uVar8 < local_f0) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7978,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  iEnd = (int *)((long)src + srcSize);
  local_88 = (int *)((long)src + (srcSize - 0x10));
  local_a4 = ((int)local_90 - (int)local_b8) + local_a4;
  ms->lazySkipping = 0;
  piVar16 = (int *)(ulong)ms->nextToUpdate;
  UVar3 = ms->rowHashLog;
  uVar8 = ((int)local_88 - (int)(local_e0 + (long)piVar16)) + 1;
  if (7 < uVar8) {
    uVar8 = 8;
  }
  uVar10 = 0;
  if (local_e0 + (long)piVar16 <= local_88) {
    uVar10 = uVar8;
  }
  pUVar5 = ms->hashTable;
  local_b0 = (int *)(ulong)(uVar10 + ms->nextToUpdate);
  local_d0 = (int *)(ulong)(0x38 - UVar3);
  local_a0 = (BYTE *)CONCAT44(local_a0._4_4_,0x18 - UVar3);
  local_58 = 1L << ((byte)local_f4 & 0x3f);
  pBVar18 = ms->tagTable;
  local_c0 = ms;
  for (; piVar16 < local_b0; piVar16 = (int *)((long)piVar16 + 1)) {
    if (0x20 < UVar3 + 8) {
LAB_0018f881:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4741,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    plVar1 = (long *)(local_e0 + (long)piVar16);
    uVar23 = local_c0->hashSalt;
    if (local_d8 == 5) {
      sVar12 = (*plVar1 * -0x30e4432345000000 ^ uVar23) >> ((byte)local_d0 & 0x3f);
    }
    else if (local_d8 == 6) {
      sVar12 = ZSTD_hash6PtrS(plVar1,UVar3 + 8,uVar23);
    }
    else {
      sVar12 = (size_t)(((int)*plVar1 * -0x61c8864f ^ (uint)uVar23) >> ((byte)local_a0 & 0x1f));
    }
    uVar8 = ((uint)(sVar12 >> 8) & 0xffffff) << ((byte)local_f4 & 0x1f);
    if (((ulong)(pUVar5 + uVar8) & 0x3f) != 0) {
LAB_0018f8a0:
      __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x76a2,
                    "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
    }
    iVar9 = ZSTD_isAligned(pBVar18 + uVar8,local_58);
    if (iVar9 == 0) {
LAB_0018f8bf:
      __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x76a3,
                    "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
    }
    local_c0->hashCache[(uint)piVar16 & 7] = (U32)sVar12;
  }
  local_a0 = local_90 + -(ulong)local_a4;
  local_60 = iEnd + -8;
  iVar9 = (int)local_e0;
  local_6c = (1 - (int)local_e8) - iVar9;
  local_74 = -iVar9;
  local_70 = ((((int)local_b8 - (int)local_e8) - (int)local_90) - iVar9) + 1;
  uVar10 = local_f0;
  piVar16 = local_c8;
  pZVar4 = local_c0;
  uVar8 = local_f4;
  do {
    while( true ) {
      local_c8 = piVar16;
      local_f0 = uVar10;
      if (local_88 <= piVar21) {
        *local_48 = local_ec;
        local_48[1] = local_f0;
        return (long)iEnd - (long)local_c8;
      }
      piVar16 = (int *)((long)piVar21 + 1);
      iVar9 = (int)piVar21;
      uVar10 = ((iVar9 - (int)local_e0) - local_ec) + 1;
      piVar20 = (int *)(local_e0 + uVar10);
      if (uVar10 < (uint)local_e8) {
        piVar20 = (int *)(local_90 + (uVar10 - local_a4));
      }
      if ((uVar10 - (uint)local_e8 < 0xfffffffd) && (*piVar20 == *piVar16)) {
        piVar24 = iEnd;
        if (uVar10 < (uint)local_e8) {
          piVar24 = local_b8;
        }
        sVar12 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar21 + 5),(BYTE *)(piVar20 + 1),(BYTE *)iEnd,
                            (BYTE *)piVar24,local_98);
        uVar23 = sVar12 + 4;
      }
      else {
        uVar23 = 0;
      }
      ofbCandidate = 999999999;
      if (local_d8 == 6) {
        if (uVar8 == 6) {
          uVar13 = ZSTD_RowFindBestMatch_dictMatchState_6_6
                             (pZVar4,(BYTE *)piVar21,(BYTE *)iEnd,&ofbCandidate);
        }
        else if (uVar8 == 5) {
          uVar13 = ZSTD_RowFindBestMatch_dictMatchState_6_5
                             (pZVar4,(BYTE *)piVar21,(BYTE *)iEnd,&ofbCandidate);
        }
        else {
          uVar13 = ZSTD_RowFindBestMatch_dictMatchState_6_4
                             (pZVar4,(BYTE *)piVar21,(BYTE *)iEnd,&ofbCandidate);
        }
      }
      else if (local_d8 == 5) {
        if (uVar8 == 6) {
          uVar13 = ZSTD_RowFindBestMatch_dictMatchState_5_6
                             (pZVar4,(BYTE *)piVar21,(BYTE *)iEnd,&ofbCandidate);
        }
        else if (uVar8 == 5) {
          uVar13 = ZSTD_RowFindBestMatch_dictMatchState_5_5
                             (pZVar4,(BYTE *)piVar21,(BYTE *)iEnd,&ofbCandidate);
        }
        else {
          uVar13 = ZSTD_RowFindBestMatch_dictMatchState_5_4
                             (pZVar4,(BYTE *)piVar21,(BYTE *)iEnd,&ofbCandidate);
        }
      }
      else if (uVar8 == 6) {
        uVar13 = ZSTD_RowFindBestMatch_dictMatchState_4_6
                           (pZVar4,(BYTE *)piVar21,(BYTE *)iEnd,&ofbCandidate);
      }
      else if (uVar8 == 5) {
        uVar13 = ZSTD_RowFindBestMatch_dictMatchState_4_5
                           (pZVar4,(BYTE *)piVar21,(BYTE *)iEnd,&ofbCandidate);
      }
      else {
        uVar13 = ZSTD_RowFindBestMatch_dictMatchState_4_4
                           (pZVar4,(BYTE *)piVar21,(BYTE *)iEnd,&ofbCandidate);
      }
      uVar14 = uVar23;
      if (uVar23 < uVar13) {
        uVar14 = uVar13;
      }
      if (3 < uVar14) break;
      uVar23 = (long)piVar21 - (long)local_c8;
      piVar21 = (int *)((long)piVar21 + (uVar23 >> 8) + 1);
      pZVar4->lazySkipping = (uint)(0x7ff < uVar23);
      uVar10 = local_f0;
      piVar16 = local_c8;
    }
    uVar19 = 1;
    if (uVar23 < uVar13) {
      piVar16 = piVar21;
      uVar19 = ofbCandidate;
    }
    local_80 = (ulong)((local_6c - local_ec) + iVar9);
    local_38 = (ulong)((local_74 - local_ec) + iVar9);
    local_40 = (ulong)((local_70 - local_ec) + iVar9);
    piVar20 = piVar21;
    local_d0 = piVar16;
    for (lVar17 = 0; uVar23 = uVar14, (int *)((long)piVar21 + lVar17) < local_88;
        lVar17 = lVar17 + 1) {
      piVar24 = (int *)((long)piVar21 + lVar17 + 1);
      iVar9 = (int)lVar17;
      uVar8 = (int)local_38 + iVar9 + 1;
      piVar16 = (int *)(local_e0 + uVar8);
      if (uVar8 < (uint)local_e8) {
        piVar16 = (int *)(local_90 + (uint)((int)local_40 + iVar9));
      }
      local_b0 = piVar20;
      if (((uint)((int)local_80 + iVar9) < 0xfffffffd) && (*piVar16 == *piVar24)) {
        piVar20 = iEnd;
        if (uVar8 < (uint)local_e8) {
          piVar20 = local_b8;
        }
        sVar12 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar21 + lVar17 + 5),(BYTE *)(piVar16 + 1),(BYTE *)iEnd,
                            (BYTE *)piVar20,local_98);
        if (sVar12 < 0xfffffffffffffffc) {
          uVar8 = 0x1f;
          if ((uint)uVar19 != 0) {
            for (; (uint)uVar19 >> uVar8 == 0; uVar8 = uVar8 - 1) {
            }
          }
          if ((int)((uVar8 ^ 0x1f) + (int)uVar14 * 3 + -0x1e) < (int)(sVar12 + 4) * 3) {
            uVar19 = 1;
            uVar23 = sVar12 + 4;
            local_d0 = piVar24;
          }
        }
      }
      ofbCandidate = 999999999;
      if (local_d8 == 6) {
        if (local_f4 == 6) {
          uVar14 = ZSTD_RowFindBestMatch_dictMatchState_6_6
                             (pZVar4,(BYTE *)piVar24,(BYTE *)iEnd,&ofbCandidate);
        }
        else if (local_f4 == 5) {
          uVar14 = ZSTD_RowFindBestMatch_dictMatchState_6_5
                             (pZVar4,(BYTE *)piVar24,(BYTE *)iEnd,&ofbCandidate);
        }
        else {
          uVar14 = ZSTD_RowFindBestMatch_dictMatchState_6_4
                             (pZVar4,(BYTE *)piVar24,(BYTE *)iEnd,&ofbCandidate);
        }
      }
      else if (local_d8 == 5) {
        if (local_f4 == 6) {
          uVar14 = ZSTD_RowFindBestMatch_dictMatchState_5_6
                             (pZVar4,(BYTE *)piVar24,(BYTE *)iEnd,&ofbCandidate);
        }
        else if (local_f4 == 5) {
          uVar14 = ZSTD_RowFindBestMatch_dictMatchState_5_5
                             (pZVar4,(BYTE *)piVar24,(BYTE *)iEnd,&ofbCandidate);
        }
        else {
          uVar14 = ZSTD_RowFindBestMatch_dictMatchState_5_4
                             (pZVar4,(BYTE *)piVar24,(BYTE *)iEnd,&ofbCandidate);
        }
      }
      else if (local_f4 == 6) {
        uVar14 = ZSTD_RowFindBestMatch_dictMatchState_4_6
                           (pZVar4,(BYTE *)piVar24,(BYTE *)iEnd,&ofbCandidate);
      }
      else if (local_f4 == 5) {
        uVar14 = ZSTD_RowFindBestMatch_dictMatchState_4_5
                           (pZVar4,(BYTE *)piVar24,(BYTE *)iEnd,&ofbCandidate);
      }
      else {
        uVar14 = ZSTD_RowFindBestMatch_dictMatchState_4_4
                           (pZVar4,(BYTE *)piVar24,(BYTE *)iEnd,&ofbCandidate);
      }
      if (uVar14 < 4) break;
      uVar8 = 0x1f;
      if ((uint)uVar19 != 0) {
        for (; (uint)uVar19 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      iVar9 = 0x1f;
      if ((uint)ofbCandidate != 0) {
        for (; (uint)ofbCandidate >> iVar9 == 0; iVar9 = iVar9 + -1) {
        }
      }
      if ((int)uVar14 * 4 - iVar9 <= (int)((uVar8 ^ 0x1f) + (int)uVar23 * 4 + -0x1b)) break;
      piVar20 = (int *)((long)local_b0 + 1);
      uVar19 = ofbCandidate;
      local_d0 = piVar20;
    }
    psVar22 = local_68;
    uVar8 = local_f4;
    uVar11 = local_f0;
    if (3 < uVar19) {
      uVar13 = (long)local_d0 + (-(long)local_e0 - uVar19) + -0xfffffffd;
      pBVar15 = local_e0;
      pBVar18 = local_98;
      if ((uint)uVar13 < (uint)local_e8) {
        pBVar15 = local_a0;
        pBVar18 = local_50;
      }
      pBVar15 = pBVar15 + (uVar13 & 0xffffffff);
      for (; ((local_c8 < local_d0 && (pBVar18 < pBVar15)) &&
             (*(BYTE *)((long)local_d0 + -1) == pBVar15[-1]));
          local_d0 = (int *)((long)local_d0 + -1)) {
        pBVar15 = pBVar15 + -1;
        uVar23 = uVar23 + 1;
      }
      uVar11 = local_ec;
      local_ec = (U32)uVar19 - 3;
    }
    if (local_68->maxNbSeq <=
        (ulong)((long)local_68->sequences - (long)local_68->sequencesStart >> 3)) {
LAB_0018f91c:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < local_68->maxNbLit) {
LAB_0018f93b:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar13 = (long)local_d0 - (long)local_c8;
    pBVar18 = local_68->lit;
    if (local_68->litStart + local_68->maxNbLit < pBVar18 + uVar13) {
LAB_0018f8de:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468e,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (iEnd < local_d0) {
LAB_0018f8fd:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (local_60 < local_d0) {
      ZSTD_safecopyLiterals(pBVar18,(BYTE *)local_c8,(BYTE *)local_d0,(BYTE *)local_60);
LAB_0018f487:
      psVar22->lit = psVar22->lit + uVar13;
      if (0xffff < uVar13) {
        if (psVar22->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        psVar22->longLengthType = ZSTD_llt_literalLength;
        psVar22->longLengthPos =
             (U32)((ulong)((long)psVar22->sequences - (long)psVar22->sequencesStart) >> 3);
      }
    }
    else {
      uVar7 = *(undefined8 *)(local_c8 + 2);
      *(undefined8 *)pBVar18 = *(undefined8 *)local_c8;
      *(undefined8 *)(pBVar18 + 8) = uVar7;
      pBVar18 = local_68->lit;
      if (0x10 < uVar13) {
        if ((BYTE *)0xffffffffffffffe0 < pBVar18 + 0x10 + (-0x10 - (long)(local_c8 + 4))) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x36a6,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar7 = *(undefined8 *)(local_c8 + 6);
        *(undefined8 *)(pBVar18 + 0x10) = *(undefined8 *)(local_c8 + 4);
        *(undefined8 *)(pBVar18 + 0x18) = uVar7;
        if (0x20 < (long)uVar13) {
          lVar17 = 0;
          do {
            puVar2 = (undefined8 *)((long)local_c8 + lVar17 + 0x20);
            uVar7 = puVar2[1];
            pBVar15 = pBVar18 + lVar17 + 0x20;
            *(undefined8 *)pBVar15 = *puVar2;
            *(undefined8 *)(pBVar15 + 8) = uVar7;
            puVar2 = (undefined8 *)((long)local_c8 + lVar17 + 0x30);
            uVar7 = puVar2[1];
            *(undefined8 *)(pBVar15 + 0x10) = *puVar2;
            *(undefined8 *)(pBVar15 + 0x18) = uVar7;
            lVar17 = lVar17 + 0x20;
          } while (pBVar15 + 0x20 < pBVar18 + uVar13);
        }
        goto LAB_0018f487;
      }
      local_68->lit = pBVar18 + uVar13;
    }
    psVar6 = psVar22->sequences;
    psVar6->litLength = (U16)uVar13;
    psVar6->offBase = (U32)uVar19;
    if (uVar23 < 3) {
LAB_0018f95a:
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x46aa,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0xffff < uVar23 - 3) {
      if (psVar22->longLengthType != ZSTD_llt_none) {
LAB_0018f979:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46ad,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      psVar22->longLengthType = ZSTD_llt_matchLength;
      psVar22->longLengthPos = (U32)((ulong)((long)psVar6 - (long)psVar22->sequencesStart) >> 3);
    }
    psVar6->mlBase = (U16)(uVar23 - 3);
    psVar22->sequences = psVar6 + 1;
    if (local_c0->lazySkipping != 0) {
      piVar21 = (int *)(ulong)local_c0->nextToUpdate;
      UVar3 = local_c0->rowHashLog;
      uVar8 = ((int)local_88 - (int)(local_e0 + (long)piVar21)) + 1;
      if (7 < uVar8) {
        uVar8 = 8;
      }
      if (local_88 < local_e0 + (long)piVar21) {
        uVar8 = 0;
      }
      pUVar5 = local_c0->hashTable;
      pBVar18 = local_c0->tagTable;
      local_c8 = (int *)(ulong)(uVar8 + local_c0->nextToUpdate);
      local_b0 = (int *)(ulong)(0x38 - UVar3);
      local_80 = CONCAT44(local_80._4_4_,0x18 - UVar3);
      local_f0 = uVar11;
      for (; piVar21 < local_c8; piVar21 = (int *)((long)piVar21 + 1)) {
        if (0x20 < UVar3 + 8) goto LAB_0018f881;
        plVar1 = (long *)(local_e0 + (long)piVar21);
        uVar13 = local_c0->hashSalt;
        if (local_d8 == 5) {
          sVar12 = (*plVar1 * -0x30e4432345000000 ^ uVar13) >> ((byte)local_b0 & 0x3f);
        }
        else if (local_d8 == 6) {
          sVar12 = ZSTD_hash6PtrS(plVar1,UVar3 + 8,uVar13);
        }
        else {
          sVar12 = (size_t)(((int)*plVar1 * -0x61c8864f ^ (uint)uVar13) >> ((byte)local_80 & 0x1f));
        }
        uVar8 = ((uint)(sVar12 >> 8) & 0xffffff) << ((byte)local_f4 & 0x1f);
        if (((ulong)(pUVar5 + uVar8) & 0x3f) != 0) goto LAB_0018f8a0;
        iVar9 = ZSTD_isAligned(pBVar18 + uVar8,local_58);
        if (iVar9 == 0) goto LAB_0018f8bf;
        local_c0->hashCache[(uint)piVar21 & 7] = (U32)sVar12;
      }
      local_c0->lazySkipping = 0;
      psVar22 = local_68;
      uVar8 = local_f4;
      uVar11 = local_f0;
    }
    for (piVar21 = (int *)((long)local_d0 + uVar23); uVar10 = uVar11, piVar16 = piVar21,
        pZVar4 = local_c0, piVar21 <= local_88; piVar21 = (int *)((long)piVar21 + sVar12 + 4)) {
      uVar11 = ((int)piVar21 - (int)local_e0) - uVar10;
      pBVar18 = local_e0;
      if (uVar11 < (uint)local_e8) {
        pBVar18 = local_a0;
      }
      if ((0xfffffffc < uVar11 - (uint)local_e8) || (*(int *)(pBVar18 + uVar11) != *piVar21)) break;
      piVar16 = iEnd;
      if (uVar11 < (uint)local_e8) {
        piVar16 = local_b8;
      }
      sVar12 = ZSTD_count_2segments
                         ((BYTE *)(piVar21 + 1),(BYTE *)((long)(pBVar18 + uVar11) + 4),(BYTE *)iEnd,
                          (BYTE *)piVar16,local_98);
      if (psVar22->maxNbSeq <=
          (ulong)((long)psVar22->sequences - (long)psVar22->sequencesStart >> 3)) goto LAB_0018f91c;
      if (0x20000 < psVar22->maxNbLit) goto LAB_0018f93b;
      pBVar18 = psVar22->lit;
      if (psVar22->litStart + psVar22->maxNbLit < pBVar18) goto LAB_0018f8de;
      if (iEnd < piVar21) goto LAB_0018f8fd;
      if (local_60 < piVar21) {
        ZSTD_safecopyLiterals(pBVar18,(BYTE *)piVar21,(BYTE *)piVar21,(BYTE *)local_60);
      }
      else {
        uVar7 = *(undefined8 *)(piVar21 + 2);
        *(undefined8 *)pBVar18 = *(undefined8 *)piVar21;
        *(undefined8 *)(pBVar18 + 8) = uVar7;
      }
      psVar6 = psVar22->sequences;
      psVar6->litLength = 0;
      psVar6->offBase = 1;
      if (sVar12 + 4 < 3) goto LAB_0018f95a;
      if (0xffff < sVar12 + 1) {
        if (psVar22->longLengthType != ZSTD_llt_none) goto LAB_0018f979;
        psVar22->longLengthType = ZSTD_llt_matchLength;
        psVar22->longLengthPos = (U32)((ulong)((long)psVar6 - (long)psVar22->sequencesStart) >> 3);
      }
      psVar6->mlBase = (U16)(sVar12 + 1);
      psVar22->sequences = psVar6 + 1;
      uVar11 = local_ec;
      local_ec = uVar10;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy_dictMatchState_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 1, ZSTD_dictMatchState);
}